

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

IteratorSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::IteratorSymbol,slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation_const&,slang::ast::DynamicArrayType&,std::basic_string_view<char,std::char_traits<char>>>
          (BumpAllocator *this,Scope *args,basic_string_view<char,_std::char_traits<char>_> *args_1,
          SourceLocation *args_2,DynamicArrayType *args_3,
          basic_string_view<char,_std::char_traits<char>_> *args_4)

{
  string_view name;
  string_view indexMethodName;
  IteratorSymbol *this_00;
  
  this_00 = (IteratorSymbol *)allocate(this,0x178,8);
  name._M_len = args_1->_M_len;
  name._M_str = args_1->_M_str;
  indexMethodName._M_len = args_4->_M_len;
  indexMethodName._M_str = args_4->_M_str;
  ast::IteratorSymbol::IteratorSymbol(this_00,args,name,*args_2,&args_3->super_Type,indexMethodName)
  ;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }